

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O2

void __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::HttpRouter
          (HttpRouter<uWS::HttpContextData<false>::RouterData> *this)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  mapped_type *pmVar3;
  long lVar4;
  int iVar5;
  string *method;
  pointer __k;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_15a;
  allocator<char> local_159;
  allocator<char> local_158;
  allocator<char> local_157;
  allocator<char> local_156;
  allocator<char> local_155;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"get",&local_151);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"post",&local_152);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"head",&local_153);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"put",&local_154);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"delete",&local_155);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"connect",&local_156);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"options",&local_157);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"trace",&local_158);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"patch",&local_159);
  __l._M_len = 9;
  __l._M_array = &local_150;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->methods,__l,&local_15a);
  lVar4 = 0x100;
  do {
    std::__cxx11::string::~string((string *)((long)&local_150._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  p_Var1 = &(this->priority)._M_t._M_impl.super__Rb_tree_header;
  (this->priority)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->priority)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->priority)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->priority)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  iVar5 = 0;
  memset(&(this->priority)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->root,"rootNode",(allocator<char> *)&local_150);
  (this->root).handlers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root).handlers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root).children.
  super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->root).handlers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root).children.
  super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->root).children.
  super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->root).isHighPriority = false;
  memset(&this->routeParameters,0,0x640);
  pbVar2 = (this->methods).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (this->methods).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar2; __k = __k + 1) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->priority,__k);
    *pmVar3 = iVar5;
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

HttpRouter() {
        int p = 0;
        for (std::string &method : methods) {
            priority[method] = p++;
        }
    }